

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::ResetCache(DFA *this,RWLocker *cache_lock)

{
  DFAStateCacheResetCallback *pDVar1;
  long in_RDI;
  DFA *in_stack_00000010;
  int i;
  RWLocker *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  atomic<re2::DFA::State_*> *this_00;
  
  RWLocker::LockForWriting(in_stack_ffffffffffffffd0);
  pDVar1 = hooks::GetDFAStateCacheResetHook();
  this_00 = *(atomic<re2::DFA::State_*> **)(in_RDI + 0xa8);
  std::
  unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
  ::size((unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
          *)0x19d917);
  (*pDVar1)((DFAStateCacheReset *)&stack0xffffffffffffffe0);
  for (iVar2 = 0; iVar2 < 8; iVar2 = iVar2 + 1) {
    std::atomic<re2::DFA::State_*>::store
              (this_00,(__pointer_type)CONCAT44(iVar2,in_stack_ffffffffffffffd8),
               (memory_order)((ulong)pDVar1 >> 0x20));
  }
  ClearCache(in_stack_00000010);
  *(undefined8 *)(in_RDI + 0xa0) = *(undefined8 *)(in_RDI + 0xa8);
  return;
}

Assistant:

void DFA::ResetCache(RWLocker* cache_lock) {
  // Re-acquire the cache_mutex_ for writing (exclusive use).
  cache_lock->LockForWriting();

  hooks::GetDFAStateCacheResetHook()({
      state_budget_,
      state_cache_.size(),
  });

  // Clear the cache, reset the memory budget.
  for (int i = 0; i < kMaxStart; i++)
    start_[i].start.store(NULL, std::memory_order_relaxed);
  ClearCache();
  mem_budget_ = state_budget_;
}